

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void duckdb::RLEScanPartialInternal<double,true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  double dVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  RLEScanState<double> *scan_state;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  double *data_pointer;
  rle_count_t *index_pointer;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  scan_state = (RLEScanState<double> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(scan_state->handle).node);
  pdVar2 = ((scan_state->handle).node.ptr)->buffer;
  data_pointer = (double *)(pdVar2 + segment->offset + 8);
  index_pointer = (rle_count_t *)(pdVar2 + (ulong)scan_state->rle_count_offset + segment->offset);
  if ((scan_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<double>(scan_state,index_pointer,data_pointer,0x800,result);
    return;
  }
  pdVar2 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  auVar5 = _DAT_01ddeb50;
  auVar4 = _DAT_01ddeb40;
  uVar9 = scan_count + result_offset;
  do {
    uVar6 = uVar9 - result_offset;
    if (uVar9 < result_offset || uVar6 == 0) {
      return;
    }
    iVar3 = scan_state->entry_pos;
    iVar8 = scan_state->position_in_entry;
    uVar7 = index_pointer[iVar3] - iVar8;
    dVar1 = data_pointer[iVar3];
    if (uVar6 < uVar7) {
      lVar10 = uVar6 + (uVar6 == 0);
      lVar11 = lVar10 + -1;
      auVar14._8_4_ = (int)lVar11;
      auVar14._0_8_ = lVar11;
      auVar14._12_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar14 = auVar14 ^ auVar5;
      uVar12 = 0;
      auVar15 = auVar4;
      do {
        auVar16 = auVar15 ^ auVar5;
        if ((bool)(~(auVar14._4_4_ < auVar16._4_4_ ||
                    auVar14._0_4_ < auVar16._0_4_ && auVar16._4_4_ == auVar14._4_4_) & 1)) {
          *(double *)(pdVar2 + uVar12 * 8 + result_offset * 8) = dVar1;
        }
        if (auVar16._12_4_ <= auVar14._12_4_ &&
            (auVar16._8_4_ <= auVar14._8_4_ || auVar16._12_4_ != auVar14._12_4_)) {
          *(double *)(pdVar2 + uVar12 * 8 + result_offset * 8 + 8) = dVar1;
        }
        uVar12 = uVar12 + 2;
        lVar11 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 2;
        auVar15._8_8_ = lVar11 + 2;
      } while ((lVar10 + 1U & 0xfffffffffffffffe) != uVar12);
      iVar8 = iVar8 + uVar6;
    }
    else {
      if (index_pointer[iVar3] != iVar8) {
        lVar10 = uVar7 - 1;
        auVar13._8_4_ = (int)lVar10;
        auVar13._0_8_ = lVar10;
        auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
        auVar13 = auVar13 ^ auVar5;
        uVar12 = 0;
        auVar16 = auVar4;
        do {
          auVar15 = auVar16 ^ auVar5;
          if ((bool)(~(auVar13._4_4_ < auVar15._4_4_ ||
                      auVar13._0_4_ < auVar15._0_4_ && auVar15._4_4_ == auVar13._4_4_) & 1)) {
            *(double *)(pdVar2 + uVar12 * 8 + result_offset * 8) = dVar1;
          }
          if (auVar15._12_4_ <= auVar13._12_4_ &&
              (auVar15._8_4_ <= auVar13._8_4_ || auVar15._12_4_ != auVar13._12_4_)) {
            *(double *)(pdVar2 + uVar12 * 8 + result_offset * 8 + 8) = dVar1;
          }
          uVar12 = uVar12 + 2;
          lVar10 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + 2;
          auVar16._8_8_ = lVar10 + 2;
        } while ((uVar7 + 1 & 0xfffffffffffffffe) != uVar12);
      }
      result_offset = result_offset + uVar7;
      scan_state->entry_pos = iVar3 + 1;
      iVar8 = 0;
    }
    scan_state->position_in_entry = iVar8;
  } while (uVar7 <= uVar6);
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}